

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.c
# Opt level: O0

U32 XXH32_finalize(U32 h32,void *ptr,size_t len,XXH_endianess endian,XXH_alignment align)

{
  uint uVar1;
  U32 UVar2;
  U32 local_1b8;
  U32 local_1b4;
  U32 local_1b0;
  U32 local_1ac;
  U32 local_1a8;
  U32 local_1a4;
  U32 local_1a0;
  U32 local_19c;
  U32 local_198;
  U32 local_194;
  U32 local_190;
  U32 local_18c;
  U32 local_188;
  U32 local_184;
  U32 local_180;
  U32 local_17c;
  U32 local_178;
  U32 local_174;
  U32 local_170;
  U32 local_16c;
  U32 local_168;
  U32 local_164;
  U32 local_160;
  U32 local_15c;
  U32 *local_150;
  BYTE *p;
  XXH_alignment align_local;
  XXH_endianess endian_local;
  size_t len_local;
  void *ptr_local;
  U32 h32_local;
  U32 local_114;
  U32 local_fc;
  U32 local_e4;
  U32 local_cc;
  U32 local_b4;
  U32 local_9c;
  U32 local_84;
  U32 local_6c;
  U32 local_54;
  U32 local_3c;
  U32 local_24;
  U32 local_c;
  
  local_150 = (U32 *)ptr;
  ptr_local._0_4_ = h32;
  switch((uint)len & 0xf) {
  case 0xc:
    if (align == XXH_unaligned) {
      if (endian == XXH_littleEndian) {
        local_15c = XXH_read32(ptr);
      }
      else {
        UVar2 = XXH_read32(ptr);
        local_15c = XXH_swap32(UVar2);
      }
      local_c = local_15c;
    }
    else {
      if (endian == XXH_littleEndian) {
        local_160 = *ptr;
      }
      else {
        local_160 = XXH_swap32(*ptr);
      }
      local_c = local_160;
    }
    uVar1 = local_c * -0x3d4d51c3 + h32;
    local_150 = (U32 *)((long)ptr + 4);
    ptr_local._0_4_ = (uVar1 * 0x20000 | uVar1 >> 0xf) * 0x27d4eb2f;
  case 8:
    if (align == XXH_unaligned) {
      if (endian == XXH_littleEndian) {
        local_164 = XXH_read32(local_150);
      }
      else {
        UVar2 = XXH_read32(local_150);
        local_164 = XXH_swap32(UVar2);
      }
      local_24 = local_164;
    }
    else {
      if (endian == XXH_littleEndian) {
        local_168 = *local_150;
      }
      else {
        local_168 = XXH_swap32(*local_150);
      }
      local_24 = local_168;
    }
    uVar1 = local_24 * -0x3d4d51c3 + (U32)ptr_local;
    local_150 = local_150 + 1;
    ptr_local._0_4_ = (uVar1 * 0x20000 | uVar1 >> 0xf) * 0x27d4eb2f;
  case 4:
    if (align == XXH_unaligned) {
      if (endian == XXH_littleEndian) {
        local_16c = XXH_read32(local_150);
      }
      else {
        UVar2 = XXH_read32(local_150);
        local_16c = XXH_swap32(UVar2);
      }
      local_3c = local_16c;
    }
    else {
      if (endian == XXH_littleEndian) {
        local_170 = *local_150;
      }
      else {
        local_170 = XXH_swap32(*local_150);
      }
      local_3c = local_170;
    }
    uVar1 = local_3c * -0x3d4d51c3 + (U32)ptr_local;
    ptr_local._4_4_ = XXH32_avalanche((uVar1 * 0x20000 | uVar1 >> 0xf) * 0x27d4eb2f);
    break;
  case 0xd:
    if (align == XXH_unaligned) {
      if (endian == XXH_littleEndian) {
        local_174 = XXH_read32(ptr);
      }
      else {
        UVar2 = XXH_read32(ptr);
        local_174 = XXH_swap32(UVar2);
      }
      local_54 = local_174;
    }
    else {
      if (endian == XXH_littleEndian) {
        local_178 = *ptr;
      }
      else {
        local_178 = XXH_swap32(*ptr);
      }
      local_54 = local_178;
    }
    uVar1 = local_54 * -0x3d4d51c3 + h32;
    local_150 = (U32 *)((long)ptr + 4);
    ptr_local._0_4_ = (uVar1 * 0x20000 | uVar1 >> 0xf) * 0x27d4eb2f;
  case 9:
    if (align == XXH_unaligned) {
      if (endian == XXH_littleEndian) {
        local_17c = XXH_read32(local_150);
      }
      else {
        UVar2 = XXH_read32(local_150);
        local_17c = XXH_swap32(UVar2);
      }
      local_6c = local_17c;
    }
    else {
      if (endian == XXH_littleEndian) {
        local_180 = *local_150;
      }
      else {
        local_180 = XXH_swap32(*local_150);
      }
      local_6c = local_180;
    }
    uVar1 = local_6c * -0x3d4d51c3 + (U32)ptr_local;
    local_150 = local_150 + 1;
    ptr_local._0_4_ = (uVar1 * 0x20000 | uVar1 >> 0xf) * 0x27d4eb2f;
  case 5:
    if (align == XXH_unaligned) {
      if (endian == XXH_littleEndian) {
        local_184 = XXH_read32(local_150);
      }
      else {
        UVar2 = XXH_read32(local_150);
        local_184 = XXH_swap32(UVar2);
      }
      local_84 = local_184;
    }
    else {
      if (endian == XXH_littleEndian) {
        local_188 = *local_150;
      }
      else {
        local_188 = XXH_swap32(*local_150);
      }
      local_84 = local_188;
    }
    uVar1 = local_84 * -0x3d4d51c3 + (U32)ptr_local;
    uVar1 = (uint)(byte)local_150[1] * 0x165667b1 + (uVar1 * 0x20000 | uVar1 >> 0xf) * 0x27d4eb2f;
    ptr_local._4_4_ = XXH32_avalanche((uVar1 * 0x800 | uVar1 >> 0x15) * -0x61c8864f);
    break;
  case 0xe:
    if (align == XXH_unaligned) {
      if (endian == XXH_littleEndian) {
        local_18c = XXH_read32(ptr);
      }
      else {
        UVar2 = XXH_read32(ptr);
        local_18c = XXH_swap32(UVar2);
      }
      local_9c = local_18c;
    }
    else {
      if (endian == XXH_littleEndian) {
        local_190 = *ptr;
      }
      else {
        local_190 = XXH_swap32(*ptr);
      }
      local_9c = local_190;
    }
    uVar1 = local_9c * -0x3d4d51c3 + h32;
    local_150 = (U32 *)((long)ptr + 4);
    ptr_local._0_4_ = (uVar1 * 0x20000 | uVar1 >> 0xf) * 0x27d4eb2f;
  case 10:
    if (align == XXH_unaligned) {
      if (endian == XXH_littleEndian) {
        local_194 = XXH_read32(local_150);
      }
      else {
        UVar2 = XXH_read32(local_150);
        local_194 = XXH_swap32(UVar2);
      }
      local_b4 = local_194;
    }
    else {
      if (endian == XXH_littleEndian) {
        local_198 = *local_150;
      }
      else {
        local_198 = XXH_swap32(*local_150);
      }
      local_b4 = local_198;
    }
    uVar1 = local_b4 * -0x3d4d51c3 + (U32)ptr_local;
    local_150 = local_150 + 1;
    ptr_local._0_4_ = (uVar1 * 0x20000 | uVar1 >> 0xf) * 0x27d4eb2f;
  case 6:
    if (align == XXH_unaligned) {
      if (endian == XXH_littleEndian) {
        local_19c = XXH_read32(local_150);
      }
      else {
        UVar2 = XXH_read32(local_150);
        local_19c = XXH_swap32(UVar2);
      }
      local_cc = local_19c;
    }
    else {
      if (endian == XXH_littleEndian) {
        local_1a0 = *local_150;
      }
      else {
        local_1a0 = XXH_swap32(*local_150);
      }
      local_cc = local_1a0;
    }
    uVar1 = local_cc * -0x3d4d51c3 + (U32)ptr_local;
    uVar1 = (uint)(byte)local_150[1] * 0x165667b1 + (uVar1 * 0x20000 | uVar1 >> 0xf) * 0x27d4eb2f;
    uVar1 = (uint)*(byte *)((long)local_150 + 5) * 0x165667b1 +
            (uVar1 * 0x800 | uVar1 >> 0x15) * -0x61c8864f;
    ptr_local._4_4_ = XXH32_avalanche((uVar1 * 0x800 | uVar1 >> 0x15) * -0x61c8864f);
    break;
  case 0xf:
    if (align == XXH_unaligned) {
      if (endian == XXH_littleEndian) {
        local_1a4 = XXH_read32(ptr);
      }
      else {
        UVar2 = XXH_read32(ptr);
        local_1a4 = XXH_swap32(UVar2);
      }
      local_e4 = local_1a4;
    }
    else {
      if (endian == XXH_littleEndian) {
        local_1a8 = *ptr;
      }
      else {
        local_1a8 = XXH_swap32(*ptr);
      }
      local_e4 = local_1a8;
    }
    uVar1 = local_e4 * -0x3d4d51c3 + h32;
    local_150 = (U32 *)((long)ptr + 4);
    ptr_local._0_4_ = (uVar1 * 0x20000 | uVar1 >> 0xf) * 0x27d4eb2f;
  case 0xb:
    if (align == XXH_unaligned) {
      if (endian == XXH_littleEndian) {
        local_1ac = XXH_read32(local_150);
      }
      else {
        UVar2 = XXH_read32(local_150);
        local_1ac = XXH_swap32(UVar2);
      }
      local_fc = local_1ac;
    }
    else {
      if (endian == XXH_littleEndian) {
        local_1b0 = *local_150;
      }
      else {
        local_1b0 = XXH_swap32(*local_150);
      }
      local_fc = local_1b0;
    }
    uVar1 = local_fc * -0x3d4d51c3 + (U32)ptr_local;
    local_150 = local_150 + 1;
    ptr_local._0_4_ = (uVar1 * 0x20000 | uVar1 >> 0xf) * 0x27d4eb2f;
  case 7:
    if (align == XXH_unaligned) {
      if (endian == XXH_littleEndian) {
        local_1b4 = XXH_read32(local_150);
      }
      else {
        UVar2 = XXH_read32(local_150);
        local_1b4 = XXH_swap32(UVar2);
      }
      local_114 = local_1b4;
    }
    else {
      if (endian == XXH_littleEndian) {
        local_1b8 = *local_150;
      }
      else {
        local_1b8 = XXH_swap32(*local_150);
      }
      local_114 = local_1b8;
    }
    uVar1 = local_114 * -0x3d4d51c3 + (U32)ptr_local;
    local_150 = local_150 + 1;
    ptr_local._0_4_ = (uVar1 * 0x20000 | uVar1 >> 0xf) * 0x27d4eb2f;
  case 3:
    uVar1 = (uint)(byte)*local_150 * 0x165667b1 + (U32)ptr_local;
    local_150 = (U32 *)((long)local_150 + 1);
    ptr_local._0_4_ = (uVar1 * 0x800 | uVar1 >> 0x15) * -0x61c8864f;
  case 2:
    uVar1 = (uint)(byte)*local_150 * 0x165667b1 + (U32)ptr_local;
    local_150 = (U32 *)((long)local_150 + 1);
    ptr_local._0_4_ = (uVar1 * 0x800 | uVar1 >> 0x15) * -0x61c8864f;
  case 1:
    uVar1 = (uint)(byte)*local_150 * 0x165667b1 + (U32)ptr_local;
    ptr_local._0_4_ = (uVar1 * 0x800 | uVar1 >> 0x15) * -0x61c8864f;
  case 0:
    ptr_local._4_4_ = XXH32_avalanche((U32)ptr_local);
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/../3rdparty/xxhash/xxhash.c"
                  ,0x15a,
                  "U32 XXH32_finalize(U32, const void *, size_t, XXH_endianess, XXH_alignment)");
  }
  return ptr_local._4_4_;
}

Assistant:

static U32
XXH32_finalize(U32 h32, const void* ptr, size_t len,
                XXH_endianess endian, XXH_alignment align)

{
    const BYTE* p = (const BYTE*)ptr;
#define PROCESS1             \
    h32 += (*p) * PRIME32_5; \
    p++;                     \
    h32 = XXH_rotl32(h32, 11) * PRIME32_1 ;

#define PROCESS4                         \
    h32 += XXH_get32bits(p) * PRIME32_3; \
    p+=4;                                \
    h32  = XXH_rotl32(h32, 17) * PRIME32_4 ;

    switch(len&15)  /* or switch(bEnd - p) */
    {
      case 12:      PROCESS4;
                    /* fallthrough */
      case 8:       PROCESS4;
                    /* fallthrough */
      case 4:       PROCESS4;
                    return XXH32_avalanche(h32);

      case 13:      PROCESS4;
                    /* fallthrough */
      case 9:       PROCESS4;
                    /* fallthrough */
      case 5:       PROCESS4;
                    PROCESS1;
                    return XXH32_avalanche(h32);

      case 14:      PROCESS4;
                    /* fallthrough */
      case 10:      PROCESS4;
                    /* fallthrough */
      case 6:       PROCESS4;
                    PROCESS1;
                    PROCESS1;
                    return XXH32_avalanche(h32);

      case 15:      PROCESS4;
                    /* fallthrough */
      case 11:      PROCESS4;
                    /* fallthrough */
      case 7:       PROCESS4;
                    /* fallthrough */
      case 3:       PROCESS1;
                    /* fallthrough */
      case 2:       PROCESS1;
                    /* fallthrough */
      case 1:       PROCESS1;
                    /* fallthrough */
      case 0:       return XXH32_avalanche(h32);
    }
    assert(0);
    return h32;   /* reaching this point is deemed impossible */
}